

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputLayers.cpp
# Opt level: O3

void CoreMLConverter::convertCaffeInputLayers(ConvertLayerParameters layerParameters)

{
  string *psVar1;
  void *pvVar2;
  long lVar3;
  int iVar4;
  const_iterator __cbeg_1;
  Type *pTVar5;
  ostream *poVar6;
  LogMessage *pLVar7;
  long lVar8;
  mapped_type *this;
  runtime_error *prVar9;
  const_iterator __cbeg;
  long *plVar10;
  long *plVar11;
  InputParameter *pIVar12;
  vector<long,_std::allocator<long>_> dims;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
  *in_stack_00000038;
  stringstream ss;
  int *in_stack_00000048;
  vector<long,_std::allocator<long>_> local_1f8;
  LogFinisher local_1d8 [32];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     ((RepeatedPtrFieldBase *)
                      (dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish + 0xe),*in_stack_00000048);
  iVar4 = std::__cxx11::string::compare((char *)(pTVar5->type_).ptr_);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"WARNING: Skipping Data Layer \'",0x1e);
    psVar1 = (pTVar5->name_).ptr_;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' of type \'",0xb);
    psVar1 = (pTVar5->type_).ptr_;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"\'. It is recommended to use Input layer for deployment.",0x37);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    return;
  }
  pIVar12 = pTVar5->input_param_;
  if (pIVar12 == (InputParameter *)0x0) {
    pIVar12 = (InputParameter *)&caffe::_InputParameter_default_instance_;
  }
  iVar4 = (pIVar12->shape_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar4 == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"Invalid caffe model: Input layer \'",0x22);
    psVar1 = (pTVar5->name_).ptr_;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_1b8 + 0x10),(psVar1->_M_dataplus)._M_p,
                        psVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"\' does not specify the shape parameter.",0x27);
    std::endl<char,std::char_traits<char>>(poVar6);
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)local_1d8);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (iVar4 < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_1b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar7 = google::protobuf::internal::LogMessage::operator<<
                       ((LogMessage *)local_1b8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(local_1d8,pLVar7);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1b8);
  }
  pvVar2 = ((pIVar12->shape_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (long *)0x0;
  local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (long *)0x0;
  local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (long *)0x0;
  lVar8 = (long)*(int *)((long)pvVar2 + 0x18);
  if (lVar8 == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"Invalid caffe model: Input layer \'",0x22);
    psVar1 = (pTVar5->name_).ptr_;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_1b8 + 0x10),(psVar1->_M_dataplus)._M_p,
                        psVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"\' does not specify dimensions.",0x1e);
    std::endl<char,std::char_traits<char>>(poVar6);
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)local_1d8);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar3 = *(long *)((long)pvVar2 + 0x20);
  plVar11 = (long *)(lVar3 + 8);
  if (lVar3 == 0) {
    plVar11 = (long *)0x0;
  }
  plVar10 = (long *)(lVar3 + 8 + lVar8 * 8);
  if (lVar3 == 0) {
    plVar10 = (long *)0x0;
  }
  while( true ) {
    if (plVar11 == plVar10) {
      if ((long)local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start == 0x10) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Ignoring batch/seq size and retaining only the last dimension for conversion. ",
                   0x4e);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
        std::ostream::put('\0');
        std::ostream::flush();
        plVar11 = local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
        if (local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start != plVar11) {
          *local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
           ._M_start = *plVar11;
          plVar11 = (long *)(((long)local_1f8.super__Vector_base<long,_std::allocator<long>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)plVar11) +
                            (long)local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          if (local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish != plVar11) {
            local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish = plVar11;
          }
        }
      }
      if (0x18 < (ulong)((long)local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Ignoring batch size and retaining only the trailing 3 dimensions for conversion. "
                   ,0x51);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
        std::ostream::put('\0');
        std::ostream::flush();
        plVar11 = local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish + -3;
        if (local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start != plVar11) {
          lVar8 = *plVar11;
          lVar3 = local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish[-2];
          local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start[2] = local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_finish[-1];
          *local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
           ._M_start = lVar8;
          local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start[1] = lVar3;
          plVar11 = (long *)(((long)local_1f8.super__Vector_base<long,_std::allocator<long>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)plVar11) +
                            (long)local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          if (local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish != plVar11) {
            local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish = plVar11;
          }
        }
      }
      iVar4 = (pTVar5->top_).super_RepeatedPtrFieldBase.current_size_;
      if (iVar4 == 0) {
        local_1b8._0_8_ = local_1b8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b8,"Caffe layer does not have a top blob ","");
        errorInCaffeProto((string *)local_1b8,(pTVar5->name_).ptr_,(pTVar5->type_).ptr_);
        if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
          operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
        }
        iVar4 = (pTVar5->top_).super_RepeatedPtrFieldBase.current_size_;
      }
      if (iVar4 < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_1b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar7 = google::protobuf::internal::LogMessage::operator<<
                           ((LogMessage *)local_1b8,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=(local_1d8,pLVar7);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1b8);
      }
      this = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
             ::operator[](in_stack_00000038,
                          (key_type *)((pTVar5->top_).super_RepeatedPtrFieldBase.rep_)->elements[0])
      ;
      std::vector<long,_std::allocator<long>_>::operator=(this,&local_1f8);
      if ((pTVar5->top_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_1b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar7 = google::protobuf::internal::LogMessage::operator<<
                           ((LogMessage *)local_1b8,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=(local_1d8,pLVar7);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1b8);
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                (_ss,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((pTVar5->top_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
      if (local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (long *)0x0) {
        operator_delete(local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return;
    }
    if (*plVar11 < 0) break;
    if (local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                ((vector<long,std::allocator<long>> *)&local_1f8,
                 (iterator)
                 local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish,plVar11);
    }
    else {
      *local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_finish = *plVar11;
      local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    plVar11 = plVar11 + 1;
  }
  __assert_fail("dim >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/InputLayers.cpp"
                ,0x2f,
                "void CoreMLConverter::convertCaffeInputLayers(CoreMLConverter::ConvertLayerParameters)"
               );
}

Assistant:

void CoreMLConverter::convertCaffeInputLayers(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::vector<int64_t> >& mapBlobNameToDimensions = layerParameters.mapBlobNameToDimensions;
    std::set<std::string>& caffeNetworkInputNames = layerParameters.caffeNetworkInputNames;
    
    /*
     Mapping from Caffe Input Layer dimensions to CoreML Specification input dimensions:
     1-D (C) ----> (C)
     2-D : (Batch/Seq,C) ----> (C) [last dimension retained]
     >=3-D (...,C,H,W) ----> (C,H,W) [last 3 dimensions retained]
     */
    
    if (caffeLayer.type() == "Input"){
        if (caffeLayer.input_param().shape_size() == 0) {
            std::stringstream ss;
            ss << "Invalid caffe model: Input layer '" << caffeLayer.name() << "' does not specify the shape parameter." << std::endl;
            throw std::runtime_error(ss.str());
        }
        const ::caffe::BlobShape& shape = caffeLayer.input_param().shape(0);
        std::vector<int64_t> dims;
        if (shape.dim_size() == 0) {
            std::stringstream ss;
            ss << "Invalid caffe model: Input layer '" << caffeLayer.name() << "' does not specify dimensions." << std::endl;
            throw std::runtime_error(ss.str());
        }
        for (const auto& dim: shape.dim()) {
            assert(dim >= 0);
            dims.push_back(dim);
        }
        if (dims.size() == 2) {
            std::cout<<"Ignoring batch/seq size and retaining only the last dimension for conversion. " << std::endl;
            dims.erase(dims.begin(),dims.end()-1);
        }
        if (dims.size() > 3) {
            std::cout<<"Ignoring batch size and retaining only the trailing 3 dimensions for conversion. " << std::endl;
            dims.erase(dims.begin(),dims.end()-3);
        }
        
        
        if (caffeLayer.top_size() == 0) {
            CoreMLConverter::errorInCaffeProto("Caffe layer does not have a top blob ",caffeLayer.name(),caffeLayer.type());
        }
        mapBlobNameToDimensions[caffeLayer.top(0)] = dims;
        caffeNetworkInputNames.insert(caffeLayer.top(0));
    } else {
        std::cout<<"WARNING: Skipping Data Layer '"<< caffeLayer.name() << "' of type '" << caffeLayer.type() <<"'. It is recommended to use Input layer for deployment."
                <<std::endl;
    }
}